

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O3

void __thiscall
ConfidentialTransaction_SetIssuance_Test::TestBody(ConfidentialTransaction_SetIssuance_Test *this)

{
  ByteData256 BVar1;
  ByteData256 BVar2;
  ConfidentialValue CVar3;
  ConfidentialValue CVar4;
  ByteData BVar5;
  bool bVar6;
  AssertHelperData *pAVar7;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  uint in_stack_fffffffffffffbc8;
  uint uVar11;
  undefined4 in_stack_fffffffffffffbcc;
  undefined4 uVar12;
  pointer in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd8 [16];
  AssertionResult gtest_ar_2;
  AssertHelper local_408;
  AssertHelperData *pAStack_400;
  long local_3f8;
  undefined1 auStack_3f0 [16];
  AssertionResult gtest_ar;
  undefined8 local_3d0;
  undefined1 in_stack_fffffffffffffc38 [16];
  uint32_t in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  _Vector_impl_data in_stack_fffffffffffffc50;
  uint32_t local_378;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_368;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_350;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_338;
  ConfidentialValue CStack_320;
  ConfidentialValue CStack_2f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_2d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_2b8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> vStack_298;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_280;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_268;
  ConfidentialValue local_250;
  ConfidentialValue local_228;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_200;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  ConfidentialTxInReference txin;
  ConfidentialTransaction tx;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx,(string *)&exp_tx_hex_abi_cxx11_);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::core::ConfidentialTransaction::AddTxIn((Txid *)&tx,0x4e9ee8,2,(Script *)0xfffffffe);
    }
  }
  else {
    testing::Message::Message((Message *)&txin);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xff,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&txin);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (((txin.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       (txin.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0)) {
      (**(code **)(*txin.super_AbstractTxInReference._vptr_AbstractTxInReference + 8))();
    }
  }
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_268,&exp_blinding_nonce.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_280,&exp_asset_entropy.data_);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_228,&exp_issuance_amount);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_250,&exp_inflation_keys);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_1e8,&exp_issuance_amount_rangeproof.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_200,&exp_inflation_keys_rangeproof.data_);
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_200;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_1e8;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffffbc8;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffffbcc;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffbd8._0_8_;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffbd8._8_8_;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = in_stack_fffffffffffffbd0;
      CVar3._vptr_ConfidentialValue._1_7_ = gtest_ar_2._1_7_;
      CVar3._vptr_ConfidentialValue._0_1_ = gtest_ar_2.success_;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)gtest_ar_2.message_.ptr_;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_408.data_;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pAStack_400;
      CVar3._32_8_ = local_3f8;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = gtest_ar.success_;
      CVar4._vptr_ConfidentialValue = (_func_int **)auStack_3f0._0_8_;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)auStack_3f0._8_8_;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = gtest_ar._1_7_;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)gtest_ar.message_.ptr_;
      CVar4._32_8_ = local_3d0;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffffc48;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc38._0_8_;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc38._8_8_;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffffc4c;
      cfd::core::ConfidentialTransaction::SetIssuance
                ((uint)&tx,BVar1,BVar2,CVar3,CVar4,BVar5,(ByteData)in_stack_fffffffffffffc50);
      if (local_200.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_200.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_250._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_004e0f10;
      if (local_250.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_250.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_228._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_004e0f10;
      if (local_228.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_268.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&txin);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x105,
               "Expected: (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy, exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof, exp_inflation_keys_rangeproof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&txin);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (((txin.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       (txin.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0)) {
      (**(code **)(*txin.super_AbstractTxInReference._vptr_AbstractTxInReference + 8))();
    }
  }
  cfd::core::ConfidentialTxInReference::ConfidentialTxInReference(&txin);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::core::ConfidentialTransaction::GetTxIn((uint)&gtest_ar);
      cfd::core::Txid::operator=(&txin.super_AbstractTxInReference.txid_,(Txid *)&gtest_ar.message_)
      ;
      txin.super_AbstractTxInReference.vout_ = in_stack_fffffffffffffc48;
      cfd::core::Script::operator=
                (&txin.super_AbstractTxInReference.unlocking_script_,
                 (Script *)&stack0xfffffffffffffc50);
      txin.super_AbstractTxInReference.sequence_ = local_378;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&txin.super_AbstractTxInReference.script_witness_.witness_stack_,&local_368);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&txin.blinding_nonce_.data_,&vStack_350);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&txin.asset_entropy_.data_,&vStack_338);
      cfd::core::ConfidentialValue::operator=(&txin.issuance_amount_,&CStack_320);
      cfd::core::ConfidentialValue::operator=(&txin.inflation_keys_,&CStack_2f8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&txin.issuance_amount_rangeproof_.data_,&vStack_2d0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&txin.inflation_keys_rangeproof_.data_,&vStack_2b8);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&txin.pegin_witness_.witness_stack_,&vStack_298);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x108,
               "Expected: (txin = tx.GetTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (((CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetVout()","exp_index",(uint *)&stack0xfffffffffffffbc8,
             &exp_index);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xfffffffffffffbc8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10a,pcVar9);
    testing::internal::AssertHelper::operator=(&local_408,(Message *)&stack0xfffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    if (((CONCAT44(in_stack_fffffffffffffbcc,txin.super_AbstractTxInReference.vout_) != 0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       ((long *)CONCAT44(in_stack_fffffffffffffbcc,txin.super_AbstractTxInReference.vout_) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffbcc,
                                     txin.super_AbstractTxInReference.vout_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetSequence()","exp_sequence",
             (uint *)&stack0xfffffffffffffbc8,&exp_sequence);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xfffffffffffffbc8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10b,pcVar9);
    testing::internal::AssertHelper::operator=(&local_408,(Message *)&stack0xfffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    if (((CONCAT44(in_stack_fffffffffffffbcc,txin.super_AbstractTxInReference.sequence_) != 0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       ((long *)CONCAT44(in_stack_fffffffffffffbcc,txin.super_AbstractTxInReference.sequence_) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffbcc,
                                     txin.super_AbstractTxInReference.sequence_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Txid::Txid((Txid *)&stack0xfffffffffffffbc8,&txin.super_AbstractTxInReference.txid_);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar9 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::Txid::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar9,(char *)local_408.data_);
  if (local_408.data_ != (AssertHelperData *)&local_3f8) {
    operator_delete(local_408.data_);
  }
  if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_3d0) {
    operator_delete((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  uVar11 = 0x4ccb78;
  uVar12 = 0;
  if (in_stack_fffffffffffffbd0 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffbd0);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10c,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (((CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)&gtest_ar,&txin.super_AbstractTxInReference.unlocking_script_)
  ;
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar9 = (char *)CONCAT44(uVar12,uVar11);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar9,(char *)local_408.data_);
  if (local_408.data_ != (AssertHelperData *)&local_3f8) {
    operator_delete(local_408.data_);
  }
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  cfd::core::Script::~Script((Script *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10e,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (((CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_408.data_ = (AssertHelperData *)0x0;
  pAStack_400 = (AssertHelperData *)0x0;
  local_3f8 = 0;
  uVar8 = (long)txin.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar7 = (AssertHelperData *)0x0;
    sVar10 = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar7 = (AssertHelperData *)operator_new(uVar8);
    sVar10 = (long)txin.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)txin.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  local_3f8 = uVar8 + (long)pAVar7;
  local_408.data_ = pAVar7;
  if (txin.blinding_nonce_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      txin.blinding_nonce_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pAStack_400 = pAVar7;
    memmove(pAVar7,txin.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar10);
  }
  pAStack_400 = (AssertHelperData *)((long)&pAVar7->type + sVar10);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar9 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",pcVar9,(char *)CONCAT44(uVar12,uVar11));
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_3d0) {
    operator_delete((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (local_408.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_408.data_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x110,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (((CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_408.data_ = (AssertHelperData *)0x0;
  pAStack_400 = (AssertHelperData *)0x0;
  local_3f8 = 0;
  uVar8 = (long)txin.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar7 = (AssertHelperData *)0x0;
    sVar10 = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar7 = (AssertHelperData *)operator_new(uVar8);
    sVar10 = (long)txin.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)txin.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  local_3f8 = uVar8 + (long)pAVar7;
  local_408.data_ = pAVar7;
  if (txin.asset_entropy_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      txin.asset_entropy_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pAStack_400 = pAVar7;
    memmove(pAVar7,txin.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar10);
  }
  pAStack_400 = (AssertHelperData *)((long)&pAVar7->type + sVar10);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar9 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",pcVar9,(char *)CONCAT44(uVar12,uVar11));
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_3d0) {
    operator_delete((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (local_408.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_408.data_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x112,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (((CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,&txin.issuance_amount_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar9 = (char *)CONCAT44(uVar12,uVar11);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",pcVar9,(char *)local_408.data_);
  if (local_408.data_ != (AssertHelperData *)&local_3f8) {
    operator_delete(local_408.data_);
  }
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0x4e0f;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x114,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (((CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,&txin.inflation_keys_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar9 = (char *)CONCAT44(uVar12,uVar11);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",pcVar9,(char *)local_408.data_);
  if (local_408.data_ != (AssertHelperData *)&local_3f8) {
    operator_delete(local_408.data_);
  }
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0x4e0f;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x116,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (((CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_408.data_ = (AssertHelperData *)0x0;
  pAStack_400 = (AssertHelperData *)0x0;
  local_3f8 = 0;
  uVar8 = (long)txin.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar7 = (AssertHelperData *)0x0;
    sVar10 = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar7 = (AssertHelperData *)operator_new(uVar8);
    sVar10 = (long)txin.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)txin.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  local_3f8 = uVar8 + (long)pAVar7;
  local_408.data_ = pAVar7;
  if (txin.issuance_amount_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      txin.issuance_amount_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pAStack_400 = pAVar7;
    memmove(pAVar7,txin.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar10);
  }
  pAStack_400 = (AssertHelperData *)((long)&pAVar7->type + sVar10);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar9 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",pcVar9,
             (char *)CONCAT44(uVar12,uVar11));
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_3d0) {
    operator_delete((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (local_408.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_408.data_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x118,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (((CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_408.data_ = (AssertHelperData *)0x0;
  pAStack_400 = (AssertHelperData *)0x0;
  local_3f8 = 0;
  uVar8 = (long)txin.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar7 = (AssertHelperData *)0x0;
    sVar10 = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar7 = (AssertHelperData *)operator_new(uVar8);
    sVar10 = (long)txin.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)txin.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  local_3f8 = uVar8 + (long)pAVar7;
  local_408.data_ = pAVar7;
  if (txin.inflation_keys_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      txin.inflation_keys_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pAStack_400 = pAVar7;
    memmove(pAVar7,txin.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar10);
  }
  pAStack_400 = (AssertHelperData *)((long)&pAVar7->type + sVar10);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar9 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",pcVar9,(char *)CONCAT44(uVar12,uVar11)
            );
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_3d0) {
    operator_delete((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (local_408.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_408.data_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x11a,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (((CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&txin);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetIssuance) {
  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW(
      (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));

  EXPECT_NO_THROW(
      (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy,
                      exp_issuance_amount, exp_inflation_keys,
                      exp_issuance_amount_rangeproof,
                      exp_inflation_keys_rangeproof)));

  ConfidentialTxInReference txin;
  EXPECT_NO_THROW((txin = tx.GetTxIn(1)));

  EXPECT_EQ(txin.GetVout(), exp_index);
  EXPECT_EQ(txin.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txin.GetBlindingNonce().GetHex().c_str(),
               exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txin.GetAssetEntropy().GetHex().c_str(),
               exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmount().GetHex().c_str(),
               exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeys().GetHex().c_str(),
               exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmountRangeproof().GetHex().c_str(),
               exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeysRangeproof().GetHex().c_str(),
               exp_inflation_keys_rangeproof.GetHex().c_str());
}